

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O1

size_t absl::lts_20250127::strings_internal::CalculateBase64EscapedLenInternal
                 (size_t input_len,bool do_padding)

{
  ulong uVar1;
  size_t sVar2;
  string death_message;
  long *local_58 [2];
  long local_48 [2];
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if (input_len < 0xbffffffffffffffe) {
    uVar1 = (input_len / 3) * 4;
    if (input_len != (input_len / 3) * 3) {
      if (input_len % 3 == 1) {
        sVar2 = uVar1 | 2;
      }
      else {
        sVar2 = uVar1 | 3;
      }
      uVar1 = uVar1 + 4;
      if (!do_padding) {
        uVar1 = sVar2;
      }
    }
    return uVar1;
  }
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,"Check input_len <= kMaxSize failed: ","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"CalculateBase64EscapedLenInternal() overflow","");
  std::__cxx11::string::_M_append((char *)local_38,(ulong)local_58[0]);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
            (3,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/escaping.cc"
             ,0x2b,local_38);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/escaping.cc"
                ,0x2b,
                "size_t absl::strings_internal::CalculateBase64EscapedLenInternal(size_t, bool)");
}

Assistant:

size_t CalculateBase64EscapedLenInternal(size_t input_len, bool do_padding) {
  // Base64 encodes three bytes of input at a time. If the input is not
  // divisible by three, we pad as appropriate.
  //
  // Base64 encodes each three bytes of input into four bytes of output.
  constexpr size_t kMaxSize = (std::numeric_limits<size_t>::max() - 1) / 4 * 3;
  ABSL_INTERNAL_CHECK(input_len <= kMaxSize,
                      "CalculateBase64EscapedLenInternal() overflow");
  size_t len = (input_len / 3) * 4;

  // Since all base 64 input is an integral number of octets, only the following
  // cases can arise:
  if (input_len % 3 == 0) {
    // (from https://tools.ietf.org/html/rfc3548)
    // (1) the final quantum of encoding input is an integral multiple of 24
    // bits; here, the final unit of encoded output will be an integral
    // multiple of 4 characters with no "=" padding,
  } else if (input_len % 3 == 1) {
    // (from https://tools.ietf.org/html/rfc3548)
    // (2) the final quantum of encoding input is exactly 8 bits; here, the
    // final unit of encoded output will be two characters followed by two
    // "=" padding characters, or
    len += 2;
    if (do_padding) {
      len += 2;
    }
  } else {  // (input_len % 3 == 2)
    // (from https://tools.ietf.org/html/rfc3548)
    // (3) the final quantum of encoding input is exactly 16 bits; here, the
    // final unit of encoded output will be three characters followed by one
    // "=" padding character.
    len += 3;
    if (do_padding) {
      len += 1;
    }
  }

  return len;
}